

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

int iface_bind(int fd,int ifindex,char *ebuf)

{
  uchar auVar1 [8];
  int iVar2;
  int *piVar3;
  char *pcVar4;
  socklen_t local_3c;
  int local_38;
  socklen_t errlen;
  int err;
  sockaddr_ll sll;
  char *ebuf_local;
  int ifindex_local;
  int fd_local;
  
  local_3c = 4;
  sll.sll_addr = (uchar  [8])ebuf;
  memset(&errlen,0,0x14);
  errlen._0_2_ = 0x11;
  err = ifindex;
  errlen._2_2_ = htons(3);
  iVar2 = bind(fd,(sockaddr *)&errlen,0x14);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    auVar1 = sll.sll_addr;
    if (*piVar3 == 100) {
      ifindex_local = -9;
    }
    else {
      piVar3 = __errno_location();
      pcVar4 = pcap_strerror(*piVar3);
      snprintf((char *)auVar1,0x100,"bind: %s",pcVar4);
      ifindex_local = -1;
    }
  }
  else {
    iVar2 = getsockopt(fd,1,4,&local_38,&local_3c);
    auVar1 = sll.sll_addr;
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      pcVar4 = pcap_strerror(*piVar3);
      snprintf((char *)auVar1,0x100,"getsockopt: %s",pcVar4);
      ifindex_local = 0;
    }
    else if (local_38 == 100) {
      ifindex_local = -9;
    }
    else if (local_38 < 1) {
      ifindex_local = 1;
    }
    else {
      pcVar4 = pcap_strerror(local_38);
      snprintf((char *)auVar1,0x100,"bind: %s",pcVar4);
      ifindex_local = 0;
    }
  }
  return ifindex_local;
}

Assistant:

static int
iface_bind(int fd, int ifindex, char *ebuf)
{
	struct sockaddr_ll	sll;
	int			err;
	socklen_t		errlen = sizeof(err);

	memset(&sll, 0, sizeof(sll));
	sll.sll_family		= AF_PACKET;
	sll.sll_ifindex		= ifindex;
	sll.sll_protocol	= htons(ETH_P_ALL);

	if (bind(fd, (struct sockaddr *) &sll, sizeof(sll)) == -1) {
		if (errno == ENETDOWN) {
			/*
			 * Return a "network down" indication, so that
			 * the application can report that rather than
			 * saying we had a mysterious failure and
			 * suggest that they report a problem to the
			 * libpcap developers.
			 */
			return PCAP_ERROR_IFACE_NOT_UP;
		} else {
			pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
				 "bind: %s", pcap_strerror(errno));
			return PCAP_ERROR;
		}
	}

	/* Any pending errors, e.g., network is down? */

	if (getsockopt(fd, SOL_SOCKET, SO_ERROR, &err, &errlen) == -1) {
		pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
			"getsockopt: %s", pcap_strerror(errno));
		return 0;
	}

	if (err == ENETDOWN) {
		/*
		 * Return a "network down" indication, so that
		 * the application can report that rather than
		 * saying we had a mysterious failure and
		 * suggest that they report a problem to the
		 * libpcap developers.
		 */
		return PCAP_ERROR_IFACE_NOT_UP;
	} else if (err > 0) {
		pcap_snprintf(ebuf, PCAP_ERRBUF_SIZE,
			"bind: %s", pcap_strerror(err));
		return 0;
	}

	return 1;
}